

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cc
# Opt level: O2

void bloaty::DisassembleFindReferences(DisassemblyInfo *info,RangeSink *sink)

{
  byte bVar1;
  cs_detail *pcVar2;
  int line;
  _Bool _Var3;
  cs_err cVar4;
  cs_insn *insn;
  uint64_t addr;
  long lVar5;
  char *str;
  csh handle;
  RangeSink *local_50;
  size_t size;
  uint64_t address;
  uint8_t *ptr;
  
  if (info->arch != CS_ARCH_X86) {
    return;
  }
  local_50 = sink;
  cVar4 = cs_open(CS_ARCH_X86,info->mode,&handle);
  if ((cVar4 == CS_ERR_OK) && (cVar4 = cs_option(handle,CS_OPT_DETAIL,3), cVar4 == CS_ERR_OK)) {
    if ((info->text)._M_len != 0) {
      insn = cs_malloc(handle);
      address = info->start_address;
      ptr = (uint8_t *)(info->text)._M_str;
      size = (info->text)._M_len;
      do {
        if (size == 0) {
LAB_00185d02:
          cs_free(insn,1);
          cs_close(&handle);
          return;
        }
        _Var3 = cs_disasm_iter(handle,&ptr,&size,&address,insn);
        if (!_Var3) {
          if (1 < verbose_level) {
            printf("Error disassembling function at address: %lx\n",address);
          }
          goto LAB_00185d02;
        }
        bVar1 = (insn->detail->field_6).x86.op_count;
        for (lVar5 = 0; (ulong)bVar1 * 0x30 - lVar5 != 0; lVar5 = lVar5 + 0x30) {
          pcVar2 = insn->detail;
          if ((((*(int *)(pcVar2->groups + lVar5 + 0x55) == 3) &&
               (*(int *)(pcVar2->groups + lVar5 + 0x61) == 0x29)) &&
              (*(int *)(pcVar2->groups + lVar5 + 0x5d) == 0)) &&
             (*(int *)(pcVar2->groups + lVar5 + 0x65) == 0)) {
            addr = (ulong)insn->size + insn->address + *(long *)(pcVar2->groups + lVar5 + 0x6d);
            if (addr != 0) {
              RangeSink::AddVMRangeForVMAddr
                        (local_50,"x86_disassemble",insn->address,addr,0xffffffffffffffff);
            }
          }
        }
      } while( true );
    }
    cs_close(&handle);
    str = "Tried to disassemble empty function.";
    line = 0x39;
  }
  else {
    str = "Couldn\'t initialize Capstone";
    line = 0x34;
  }
  Throw(str,line);
}

Assistant:

void DisassembleFindReferences(const DisassemblyInfo& info, RangeSink* sink) {
  if (info.arch != CS_ARCH_X86) {
    // x86 only for now.
    return;
  }

  csh handle;
  if (cs_open(info.arch, info.mode, &handle) != CS_ERR_OK ||
      cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON) != CS_ERR_OK) {
    THROW("Couldn't initialize Capstone");
  }

  if (info.text.size() == 0) {
    cs_close(&handle);
    THROW("Tried to disassemble empty function.");
  }

  cs_insn *in = cs_malloc(handle);
  uint64_t address = info.start_address;
  const uint8_t* ptr = reinterpret_cast<const uint8_t*>(info.text.data());
  size_t size = info.text.size();

  while (size > 0) {
    if (!cs_disasm_iter(handle, &ptr, &size, &address, in)) {
      // Some symbols that end up in the .text section aren't really functions
      // but data.  Not sure why this happens.
      if (verbose_level > 1) {
        printf("Error disassembling function at address: %" PRIx64 "\n",
               address);
      }
      goto cleanup;
    }

    size_t count = in->detail->x86.op_count;
    for (size_t i = 0; i < count; i++) {
      cs_x86_op* op = &in->detail->x86.operands[i];
      if (op->type == X86_OP_MEM && op->mem.base == X86_REG_RIP &&
          op->mem.segment == X86_REG_INVALID &&
          op->mem.index == X86_REG_INVALID) {
        uint64_t to_address = in->address + in->size + op->mem.disp;
        if (to_address) {
          sink->AddVMRangeForVMAddr("x86_disassemble", in->address, to_address,
                                    RangeSink::kUnknownSize);
        }
      }
    }
  }

cleanup:
  cs_free(in, 1);
  cs_close(&handle);
}